

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O0

vector<signed_char,_std::allocator<signed_char>_> * __thiscall
pipe_organ_fn::operator()
          (vector<signed_char,_std::allocator<signed_char>_> *__return_storage_ptr__,
          pipe_organ_fn *this,vector<signed_char,_std::allocator<signed_char>_> *c)

{
  iterator iVar1;
  iterator __last;
  difference_type dVar2;
  __normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_> local_40
  ;
  __normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_> local_38
  ;
  char *local_30;
  __normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_> local_28
  ;
  vector<signed_char,_std::allocator<signed_char>_> *local_20;
  vector<signed_char,_std::allocator<signed_char>_> *c_local;
  pipe_organ_fn *this_local;
  
  local_20 = c;
  c_local = (vector<signed_char,_std::allocator<signed_char>_> *)this;
  this_local = (pipe_organ_fn *)__return_storage_ptr__;
  local_28._M_current = (char *)std::vector<signed_char,_std::allocator<signed_char>_>::begin(c);
  local_30 = (char *)std::vector<signed_char,_std::allocator<signed_char>_>::end(c);
  std::
  sort<__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>>
            (local_28,(__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                       )local_30);
  local_40._M_current = (char *)std::vector<signed_char,_std::allocator<signed_char>_>::begin(c);
  iVar1 = std::vector<signed_char,_std::allocator<signed_char>_>::begin(c);
  __last = std::vector<signed_char,_std::allocator<signed_char>_>::end(c);
  dVar2 = std::
          distance<__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>>
                    ((__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                      )iVar1._M_current,
                     (__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                      )__last._M_current);
  local_38 = __gnu_cxx::
             __normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
             ::operator+(&local_40,dVar2 / 2);
  iVar1 = std::vector<signed_char,_std::allocator<signed_char>_>::end(c);
  std::
  reverse<__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>>
            (local_38,(__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                       )iVar1._M_current);
  std::vector<signed_char,_std::allocator<signed_char>_>::vector(__return_storage_ptr__,c);
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Container c) const
    {
        std::sort(c.begin(), c.end());
        std::reverse(c.begin() + std::distance(c.begin(), c.end()) / 2, c.end());
        return c;
    }